

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn64.c
# Opt level: O0

void uc_init_sparc64(uc_struct_conflict8 *uc)

{
  uc_struct_conflict8 *uc_local;
  
  uc->release = sparc_release;
  uc->reg_read_sparc = reg_read_sparc64;
  uc->reg_write_sparc = reg_write_sparc64;
  uc->reg_reset = reg_reset;
  uc->set_pc = sparc_set_pc;
  uc->get_pc = sparc_get_pc;
  uc->stop_interrupt = sparc_stop_interrupt;
  uc->cpus_init = sparc_cpus_init;
  uc_common_init(uc);
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->release = sparc_release;
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->set_pc = sparc_set_pc;
    uc->get_pc = sparc_get_pc;
    uc->stop_interrupt = sparc_stop_interrupt;
    uc->cpus_init = sparc_cpus_init;
    uc_common_init(uc);
}